

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  byte bVar1;
  char *__s1;
  char *__s2;
  bool bVar2;
  int iVar3;
  
  bVar1 = this->field_0x8;
  if (bVar1 != other->field_0x8) {
    return bVar1 < (byte)other->field_0x8;
  }
  switch(bVar1) {
  case 1:
    bVar2 = (this->value_).int_ < (other->value_).int_;
    break;
  case 2:
    bVar2 = (this->value_).uint_ < (other->value_).uint_;
    break;
  case 3:
    bVar2 = (this->value_).real_ <= (other->value_).real_ &&
            (other->value_).real_ != (this->value_).real_;
    break;
  case 4:
    __s1 = (this->value_).string_;
    __s2 = (other->value_).string_;
    if (__s2 == (char *)0x0 || __s1 == (char *)0x0) {
      return __s1 == (char *)0x0 && __s2 != (char *)0x0;
    }
    if (__s1 != (char *)0x0) {
      iVar3 = strcmp(__s1,__s2);
      goto LAB_00109d13;
    }
  case 0:
    bVar2 = false;
    break;
  case 5:
    bVar2 = (this->value_).bool_ < (other->value_).bool_;
    break;
  case 6:
  case 7:
    iVar3 = (int)(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count -
            (int)(((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (iVar3 == 0) {
      bVar2 = std::operator<(&((this->value_).map_)->_M_t,&((other->value_).map_)->_M_t);
      return bVar2;
    }
LAB_00109d13:
    bVar2 = SUB41((uint)iVar3 >> 0x1f,0);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fishiu[P]mahjong/json/../jsoncpp.cpp"
                  ,0x7b7,"bool Json::Value::operator<(const Value &) const");
  }
  return bVar2;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type_ - other.type_;
  if (typeDelta)
    return typeDelta < 0 ? true : false;
  switch (type_) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue:
    return (value_.string_ == 0 && other.value_.string_) ||
           (other.value_.string_ && value_.string_ &&
            strcmp(value_.string_, other.value_.string_) < 0);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue: {
    int delta = int(value_.map_->size() - other.value_.map_->size());
    if (delta)
      return delta < 0;
    return (*value_.map_) < (*other.value_.map_);
  }
#else
  case arrayValue:
    return value_.array_->compare(*(other.value_.array_)) < 0;
  case objectValue:
    return value_.map_->compare(*(other.value_.map_)) < 0;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}